

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaAllocation_T::DedicatedAllocUnmap(VmaAllocation_T *this,VmaAllocator hAllocator)

{
  bool bVar1;
  VmaVulkanFunctions *pVVar2;
  VmaAllocator_T *in_RSI;
  VmaAllocation_T *in_RDI;
  
  if (((in_RDI->m_MapCount != '\0') &&
      (in_RDI->m_MapCount = in_RDI->m_MapCount + 0xff, in_RDI->m_MapCount == '\0')) &&
     (bVar1 = IsPersistentMap(in_RDI), !bVar1)) {
    (in_RDI->field_0).m_DedicatedAllocation.m_pMappedData = (void *)0x0;
    pVVar2 = VmaAllocator_T::GetVulkanFunctions(in_RSI);
    (*pVVar2->vkUnmapMemory)(in_RSI->m_hDevice,(in_RDI->field_0).m_DedicatedAllocation.m_hMemory);
  }
  return;
}

Assistant:

void VmaAllocation_T::DedicatedAllocUnmap(VmaAllocator hAllocator)
{
    VMA_ASSERT(GetType() == ALLOCATION_TYPE_DEDICATED);

    if (m_MapCount > 0)
    {
        --m_MapCount;
        if (m_MapCount == 0 && !IsPersistentMap())
        {
            m_DedicatedAllocation.m_pMappedData = VMA_NULL;
            (*hAllocator->GetVulkanFunctions().vkUnmapMemory)(
                hAllocator->m_hDevice,
                m_DedicatedAllocation.m_hMemory);
        }
    }
    else
    {
        VMA_ASSERT(0 && "Unmapping dedicated allocation not previously mapped.");
    }
}